

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

quatd * tinyusdz::slerp(quatd *__return_storage_ptr__,quatd *a,quatd *b,double t)

{
  vec<double,_4> local_a0;
  undefined1 local_80 [8];
  vec<double,_4> qret;
  vec<double,_4> qb;
  vec<double,_4> qa;
  double t_local;
  quatd *b_local;
  quatd *a_local;
  
  linalg::vec<double,_4>::vec((vec<double,_4> *)&qb.w);
  linalg::vec<double,_4>::vec((vec<double,_4> *)&qret.w);
  linalg::vec<double,_4>::vec((vec<double,_4> *)local_80);
  qb.w = (a->imag)._M_elems[0];
  qret.w = (b->imag)._M_elems[0];
  qb.x = (b->imag)._M_elems[1];
  qb.y = (b->imag)._M_elems[2];
  qb.z = b->real;
  linalg::slerp<double,4>
            (&local_a0,(linalg *)&qb.w,(vec<double,_4> *)&qret.w,(vec<double,_4> *)qb.y,t);
  (__return_storage_ptr__->imag)._M_elems[0] = local_a0.x;
  (__return_storage_ptr__->imag)._M_elems[1] = local_a0.y;
  (__return_storage_ptr__->imag)._M_elems[2] = local_a0.z;
  __return_storage_ptr__->real = local_a0.w;
  return __return_storage_ptr__;
}

Assistant:

value::quatd slerp(const value::quatd &a, const value::quatd &b, const double t) {

  linalg::vec<double, 4> qa;    
  linalg::vec<double, 4> qb;    
  linalg::vec<double, 4> qret;    

  memcpy(reinterpret_cast<value::quatd *>(&qa), &a, sizeof(double) * 4);
  memcpy(reinterpret_cast<value::quatd *>(&qb), &b, sizeof(double) * 4);

  qret = linalg::slerp(qa, qb, t);

  value::quatd ret;
  memcpy(&ret, reinterpret_cast<value::quatd *>(&qret), sizeof(double) * 4);
  return ret;
  
}